

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingAdaptedStructs.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  SessionWriter *pSVar3;
  __atomic_base<unsigned_long> _Var4;
  nanoseconds nVar5;
  Foo *in_RCX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  cx_string<12UL> cVar6;
  Empty local_7ad;
  allocator local_7ac;
  allocator local_7ab;
  allocator local_7aa;
  allocator local_7a9 [8];
  allocator local_7a1;
  undefined1 local_7a0 [8];
  _Alloc_hider local_798;
  cx_string<18UL> local_778;
  undefined1 local_760 [48];
  string local_730 [32];
  string local_710 [32];
  uint64_t local_6f0;
  string local_6e8 [32];
  string local_6c8 [32];
  undefined1 local_6a8 [48];
  string local_678 [32];
  string local_658 [32];
  uint64_t local_638;
  string local_630 [32];
  string local_610 [32];
  undefined1 local_5f0 [48];
  string local_5c0 [32];
  string local_5a0 [32];
  uint64_t local_580;
  string local_578 [32];
  string local_558 [32];
  undefined1 local_538 [48];
  string local_508 [32];
  string local_4e8 [32];
  uint64_t local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  undefined1 local_480 [48];
  string local_450 [32];
  string local_430 [32];
  uint64_t local_410;
  string local_408 [32];
  string local_3e8 [32];
  undefined1 local_3c8 [48];
  string local_398 [32];
  string local_378 [32];
  uint64_t local_358;
  string local_350 [32];
  string local_330 [32];
  undefined1 local_310 [48];
  string local_2e0 [32];
  string local_2c0 [32];
  uint64_t local_2a0;
  string local_298 [32];
  string local_278 [32];
  undefined1 local_258 [48];
  string local_228 [32];
  string local_208 [32];
  uint64_t local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  undefined1 local_1a0 [48];
  string local_170 [32];
  string local_150 [32];
  uint64_t local_130;
  string local_128 [32];
  string local_108 [32];
  undefined1 local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  uint64_t local_78;
  string local_70 [32];
  string local_50 [32];
  
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e8 + 0x10),"main",(allocator *)&local_778);
      std::__cxx11::string::string(local_b8,"main",&local_7aa);
      std::__cxx11::string::string
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ab);
      local_78 = 0x59;
      std::__cxx11::string::string(local_70,"{}",&local_7ac);
      local_7a0 = (undefined1  [8])
                  binlog::detail::concatenated_tags<char_const(&)[3],Empty>
                            ((char (*) [3])0x108084,&local_7ad);
      std::__cxx11::string::string(local_50,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e8);
      binlog::EventSource::~EventSource((EventSource *)local_e8);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)local_7a0;
    binlog::SessionWriter::addEvent<Empty>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Empty *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_1a0._0_8_ = 0;
      local_1a0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_1a0 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_170,"main",&local_7ab);
      std::__cxx11::string::string
                (local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_130 = 0x5c;
      std::__cxx11::string::string(local_128,"{}",(allocator *)&local_7ad);
      local_778._data._0_4_ = 0x7b;
      cVar6 = binlog::detail::concatenated_tags<char_const(&)[3],Single>
                        ((char (*) [3])0x108084,(Single *)&local_778);
      local_7a0 = cVar6._data._0_8_;
      local_798._M_p._0_5_ = cVar6._data._8_5_;
      std::__cxx11::string::string(local_108,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1a0);
      binlog::EventSource::~EventSource((EventSource *)local_1a0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)local_7a0;
    local_7a0._0_4_ = 0x7b;
    binlog::SessionWriter::addEvent<Single>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Single *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_258._0_8_ = 0;
      local_258._8_2_ = info;
      std::__cxx11::string::string((string *)(local_258 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_228,"main",&local_7ab);
      std::__cxx11::string::string
                (local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_1e8 = 0x5f;
      std::__cxx11::string::string(local_1e0,"{}",(allocator *)&local_7ad);
      local_7a0._0_4_ = 2;
      std::__cxx11::string::string((string *)&local_798,"three",local_7a9);
      local_778._data._0_16_ =
           binlog::detail::concatenated_tags<char_const(&)[3],Pair>
                     ((char (*) [3])0x108084,(Pair *)local_7a0);
      std::__cxx11::string::string(local_1c0,local_778._data,&local_7a1);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_258);
      binlog::EventSource::~EventSource((EventSource *)local_258);
      std::__cxx11::string::~string((string *)&local_798);
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_7a0._0_4_ = 2;
    std::__cxx11::string::string((string *)&local_798,"three",(allocator *)&local_778);
    in_RCX = (Foo *)local_7a0;
    binlog::SessionWriter::addEvent<Pair>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Pair *)in_RCX);
    std::__cxx11::string::~string((string *)&local_798);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_310._0_8_ = 0;
      local_310._8_2_ = info;
      std::__cxx11::string::string((string *)(local_310 + 0x10),"main",(allocator *)&local_778);
      std::__cxx11::string::string(local_2e0,"main",&local_7aa);
      std::__cxx11::string::string
                (local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ab);
      local_2a0 = 0x62;
      std::__cxx11::string::string(local_298,"{}",&local_7ac);
      binlog::detail::concatenated_tags<char_const(&)[3],Getter>
                ((cx_string<17UL> *)local_7a0,(detail *)0x108084,(char (*) [3])&local_7ad,
                 (Getter *)in_RCX);
      std::__cxx11::string::string(local_278,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_310);
      binlog::EventSource::~EventSource((EventSource *)local_310);
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)local_7a0;
    binlog::SessionWriter::addEvent<Getter>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Getter *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_3c8._0_8_ = 0;
      local_3c8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_3c8 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_398,"main",&local_7ab);
      std::__cxx11::string::string
                (local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_358 = 0x65;
      std::__cxx11::string::string(local_350,"{}",(allocator *)&local_7ad);
      local_778._data._0_4_ = 3;
      binlog::detail::concatenated_tags<char_const(&)[3],app::Namespaced>
                ((cx_string<25UL> *)local_7a0,(detail *)0x108084,local_778._data,
                 (Namespaced *)in_RCX);
      std::__cxx11::string::string(local_330,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_3c8);
      binlog::EventSource::~EventSource((EventSource *)local_3c8);
      LOCK();
      UNLOCK();
      main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)local_7a0;
    local_7a0._0_4_ = 3;
    binlog::SessionWriter::addEvent<app::Namespaced>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Namespaced *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_480._0_8_ = 0;
      local_480._8_2_ = info;
      std::__cxx11::string::string((string *)(local_480 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_450,"main",&local_7ab);
      std::__cxx11::string::string
                (local_430,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_410 = 0x68;
      std::__cxx11::string::string(local_408,"{}",(allocator *)&local_7ad);
      local_778._data._0_8_ = 0x400000003;
      binlog::detail::concatenated_tags<char_const(&)[3],Private>
                ((cx_string<17UL> *)local_7a0,(detail *)0x108084,local_778._data,(Private *)in_RCX);
      std::__cxx11::string::string(local_3e8,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_480);
      binlog::EventSource::~EventSource((EventSource *)local_480);
      LOCK();
      UNLOCK();
      main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)local_7a0;
    local_7a0[0] = '\x03';
    local_7a0[1] = '\0';
    local_7a0[2] = '\0';
    local_7a0[3] = '\0';
    local_7a0[4] = '\x04';
    local_7a0[5] = '\0';
    local_7a0[6] = '\0';
    local_7a0[7] = '\0';
    binlog::SessionWriter::addEvent<Private>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Private *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_538._0_8_ = 0;
      local_538._8_2_ = info;
      std::__cxx11::string::string((string *)(local_538 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_508,"main",&local_7ab);
      std::__cxx11::string::string
                (local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_4c8 = 0x6b;
      std::__cxx11::string::string(local_4c0,"{}",(allocator *)&local_7ad);
      local_778._data._0_5_ = 0x100000001;
      local_778._data._8_8_ = 0x300000002;
      binlog::detail::concatenated_tags<char_const(&)[3],Triplet<int,bool,2ul>>
                ((cx_string<29UL> *)local_7a0,(detail *)0x108084,local_778._data,
                 (Triplet<int,_bool,_2UL> *)in_RCX);
      std::__cxx11::string::string(local_4a0,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_538);
      binlog::EventSource::~EventSource((EventSource *)local_538);
      LOCK();
      UNLOCK();
      main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)local_7a0;
    local_7a0._0_5_ = 0x100000001;
    local_798._M_p = (pointer)0x300000002;
    binlog::SessionWriter::addEvent<Triplet<int,bool,2ul>>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Triplet<int,_bool,_2UL> *)in_RCX);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_5f0._0_8_ = 0;
      local_5f0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_5f0 + 0x10),"main",(allocator *)&local_778);
      std::__cxx11::string::string(local_5c0,"main",&local_7aa);
      std::__cxx11::string::string
                (local_5a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ab);
      local_580 = 0x6e;
      std::__cxx11::string::string(local_578,"{}",&local_7ac);
      binlog::detail::concatenated_tags<char_const(&)[3],first&>
                ((cx_string<31UL> *)local_7a0,(detail *)0x108084,(char (*) [3])&way,(first *)in_RCX)
      ;
      std::__cxx11::string::string(local_558,local_7a0,(allocator *)&local_7ad);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_5f0);
      binlog::EventSource::~EventSource((EventSource *)local_5f0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    in_RCX = (Foo *)&way;
    binlog::SessionWriter::addEvent<first&>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (first *)&way);
  }
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_6a8._0_8_ = 0;
      local_6a8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_6a8 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_678,"main",&local_7ab);
      std::__cxx11::string::string
                (local_658,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_638 = 0x73;
      std::__cxx11::string::string(local_630,"My foo: {}",(allocator *)&local_7ad);
      local_7a0._0_4_ = 1;
      std::__cxx11::string::string((string *)&local_798,"two",local_7a9);
      binlog::detail::concatenated_tags<char_const(&)[11],Foo>
                (&local_778,(detail *)"My foo: {}",(char (*) [11])local_7a0,in_RCX);
      std::__cxx11::string::string(local_610,local_778._data,&local_7a1);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_6a8);
      binlog::EventSource::~EventSource((EventSource *)local_6a8);
      std::__cxx11::string::~string((string *)&local_798);
      LOCK();
      UNLOCK();
      main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_7a0._0_4_ = 1;
    std::__cxx11::string::string((string *)&local_798,"two",(allocator *)&local_778);
    in_RCX = (Foo *)local_7a0;
    binlog::SessionWriter::addEvent<Foo>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,in_RCX);
    std::__cxx11::string::~string((string *)&local_798);
  }
  pSVar3 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_760._0_8_ = 0;
      local_760._8_2_ = info;
      std::__cxx11::string::string((string *)(local_760 + 0x10),"main",&local_7aa);
      std::__cxx11::string::string(local_730,"main",&local_7ab);
      std::__cxx11::string::string
                (local_710,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7ac);
      local_6f0 = 0x79;
      std::__cxx11::string::string(local_6e8,"Hierarchy: {}",(allocator *)&local_7ad);
      local_778._data._8_4_ = 2;
      local_778._data._0_8_ = 0x100000000;
      binlog::detail::concatenated_tags<char_const(&)[14],Derived>
                ((cx_string<29UL> *)local_7a0,(detail *)"Hierarchy: {}",local_778._data,
                 (Derived *)in_RCX);
      std::__cxx11::string::string(local_6c8,local_7a0,local_7a9);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_760);
      binlog::EventSource::~EventSource((EventSource *)local_760);
      LOCK();
      UNLOCK();
      main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_7a0[0] = '\0';
    local_7a0[1] = '\0';
    local_7a0[2] = '\0';
    local_7a0[3] = '\0';
    local_7a0[4] = '\x01';
    local_7a0[5] = '\0';
    local_7a0[6] = '\0';
    local_7a0[7] = '\0';
    local_798._M_p._0_4_ = 2;
    binlog::SessionWriter::addEvent<Derived>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (Derived *)local_7a0);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>((ConsumeResult *)local_7a0,(binlog *)&std::cout,out);
  return 0;
}

Assistant:

int main()
{
  BINLOG_INFO("{}", Empty{});
  // Outputs: Empty

  BINLOG_INFO("{}", Single{123});
  // Outputs: Single{ a: 123 }

  BINLOG_INFO("{}", Pair{2, "three"});
  // Outputs: Pair{ a: 2, b: three }

  BINLOG_INFO("{}", Getter{});
  // Outputs: Getter{ a: 33, b: foo }

  BINLOG_INFO("{}", app::Namespaced{3});
  // Outputs: app::Namespaced{ a: 3, b: 2 }

  BINLOG_INFO("{}", Private{});
  // Outputs: Private{ a: 3, b: 4 }

  BINLOG_INFO("{}", Triplet<int, bool, 2>{1, true, {2,3}});
  // Outputs: Triplet{ a: 1, b: true, c: [2, 3] }

  BINLOG_INFO("{}", way);
  // Outputs: first{ business: first::First }

  //[mixed

  BINLOG_INFO("My foo: {}", Foo{1, "two"});
  // Outputs: My foo: Foo{ a: 1, b: two, c: true }
  //]

  //[derived

  BINLOG_INFO("Hierarchy: {}", Derived{});
  // Outputs: Hierarchy: Derived{ Base{ a: 0 }, b: 1, c: 2 }
  //]

  binlog::consume(std::cout);
  return 0;
}